

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

bool __thiscall wallet::SQLiteBatch::TxnBegin(SQLiteBatch *this)

{
  long lVar1;
  SQliteExecHandler *pSVar2;
  SQLiteDatabase *pSVar3;
  bool bVar4;
  string sVar5;
  int iVar6;
  unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_> *puVar7;
  void *in_RSI;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  Level in_stack_ffffffffffffffa8;
  allocator<char> local_51;
  undefined7 in_stack_ffffffffffffffb1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_database->m_db != (sqlite3 *)0x0) && (this->m_txn == false)) {
    CSemaphore::wait(&this->m_database->m_write_semaphore,in_RSI);
    bVar4 = SQLiteDatabase::HasActiveTxn(this->m_database);
    sVar5 = (string)!bVar4;
    inline_assertion_check<true,bool>
              ((bool *)&stack0xffffffffffffffb0,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
               ,0x28f,"TxnBegin","!m_database.HasActiveTxn()");
    puVar7 = inline_assertion_check<true,std::unique_ptr<wallet::SQliteExecHandler,std::default_delete<wallet::SQliteExecHandler>>&>
                       (&this->m_exec_handler,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                        ,0x290,"TxnBegin","m_exec_handler");
    pSVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_wallet::SQliteExecHandler_*,_std::default_delete<wallet::SQliteExecHandler>_>
             .super__Head_base<0UL,_wallet::SQliteExecHandler_*,_false>._M_head_impl;
    pSVar3 = this->m_database;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffb0,"BEGIN TRANSACTION",&local_51);
    iVar6 = (*pSVar2->_vptr_SQliteExecHandler[2])(pSVar2,pSVar3,(string *)&stack0xffffffffffffffb0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    if (iVar6 == 0) {
      this->m_txn = true;
      bVar4 = true;
      goto LAB_009dc836;
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x5a;
    logging_function._M_str = "TxnBegin";
    logging_function._M_len = 8;
    ::LogPrintf_<>(logging_function,source_file,0x292,
                   IPC|I2P|VALIDATION|LIBEVENT|CMPCTBLOCK|REINDEX|ADDRMAN|WALLETDB|BENCH,
                   in_stack_ffffffffffffffa8,(char *)CONCAT71(in_stack_ffffffffffffffb1,sVar5));
    CSemaphore::post(&this->m_database->m_write_semaphore);
  }
  bVar4 = false;
LAB_009dc836:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::TxnBegin()
{
    if (!m_database.m_db || m_txn) return false;
    m_database.m_write_semaphore.wait();
    Assert(!m_database.HasActiveTxn());
    int res = Assert(m_exec_handler)->Exec(m_database, "BEGIN TRANSACTION");
    if (res != SQLITE_OK) {
        LogPrintf("SQLiteBatch: Failed to begin the transaction\n");
        m_database.m_write_semaphore.post();
    } else {
        m_txn = true;
    }
    return res == SQLITE_OK;
}